

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O1

void __thiscall VPath::VPathData::addPath(VPathData *this,VPathData *path,VMatrix *m)

{
  vector<VPath::Element,_std::allocator<VPath::Element>_> *this_00;
  pointer *ppVVar1;
  pointer pVVar2;
  pointer pEVar3;
  VPointF *__last;
  iterator __position;
  const_iterator __begin2;
  VPointF *__first;
  ulong __n;
  pointer __n_00;
  const_iterator __end2;
  vector<VPointF,_std::allocator<VPointF>_> *__range2;
  VPointF local_48;
  back_insert_iterator<std::vector<VPath::Element,_std::allocator<VPath::Element>_>_> local_40;
  size_t local_38;
  
  local_38 = path->m_segments;
  pVVar2 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = ((long)(path->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(path->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) +
        ((long)(this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pVVar2 >> 3);
  if ((ulong)((long)(this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)pVVar2 >> 3) < __n) {
    std::vector<VPointF,_std::allocator<VPointF>_>::reserve(&this->m_points,__n);
  }
  this_00 = &this->m_elements;
  pEVar3 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n_00 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
           _M_impl.super__Vector_impl_data._M_finish +
           (long)((path->m_elements).
                  super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                 (-(long)(path->m_elements).
                         super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl
                         .super__Vector_impl_data._M_start - (long)pEVar3));
  if ((this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage + -(long)pEVar3 < __n_00) {
    std::vector<VPath::Element,_std::allocator<VPath::Element>_>::reserve(this_00,(size_type)__n_00)
    ;
  }
  __first = (path->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
            super__Vector_impl_data._M_start;
  __last = (path->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40.container = this_00;
  if (m == (VMatrix *)0x0) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<VPointF_const*,std::back_insert_iterator<std::vector<VPointF,std::allocator<VPointF>>>>
              (__first,__last,
               (back_insert_iterator<std::vector<VPointF,_std::allocator<VPointF>_>_>)this);
  }
  else {
    for (; __first != __last; __first = __first + 1) {
      local_48 = VMatrix::map(m,__first);
      __position._M_current =
           (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<VPointF,_std::allocator<VPointF>_>::_M_realloc_insert<VPointF>
                  (&this->m_points,__position,&local_48);
      }
      else {
        *__position._M_current = local_48;
        ppVVar1 = &(this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
    }
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<VPath::Element_const*,std::back_insert_iterator<std::vector<VPath::Element,std::allocator<VPath::Element>>>>
            ((path->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (path->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
             _M_impl.super__Vector_impl_data._M_finish,local_40);
  this->m_segments = this->m_segments + local_38;
  this->mLengthDirty = true;
  return;
}

Assistant:

void VPath::VPathData::addPath(const VPathData &path, const VMatrix *m)
{
    size_t segment = path.segments();

    // make sure enough memory available
    if (m_points.capacity() < m_points.size() + path.m_points.size())
        m_points.reserve(m_points.size() + path.m_points.size());

    if (m_elements.capacity() < m_elements.size() + path.m_elements.size())
        m_elements.reserve(m_elements.size() + path.m_elements.size());

    if (m) {
        for (const auto &i : path.m_points) {
            m_points.push_back(m->map(i));
        }
    } else {
        std::copy(path.m_points.begin(), path.m_points.end(),
                  back_inserter(m_points));
    }

    std::copy(path.m_elements.begin(), path.m_elements.end(),
              back_inserter(m_elements));

    m_segments += segment;
    mLengthDirty = true;
}